

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::run_impl(QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  ostream *i_ostream;
  ulong uVar1;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *pQVar2;
  ThreadData *thread;
  uint64_t uVar3;
  pointer pTVar4;
  pointer pPVar5;
  size_t i_target_consume_count;
  pointer __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  void *__buf_00;
  void *__buf_01;
  size_t thread_index_1;
  ulong uVar6;
  histogram<long,_true> *phVar7;
  pointer pTVar8;
  ulong i_affinity_mask;
  size_t thread_index_2;
  long lVar9;
  size_t thread_index;
  ulong uVar10;
  pointer pPVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict61 threads;
  long spawned;
  FinalStats final_state;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  histogram<long,_true> histogram_spawned;
  histogram<long,_true> histogram_except_puts;
  histogram<long,_true> histogram_except_cons;
  __atomic_base<bool> local_6b6;
  byte local_6b5;
  QueueTesterFlags local_6b4;
  EasyRandom *local_6b0;
  histogram<long,_true> *local_6a8;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *local_6a0;
  QueueTesterFlags local_694;
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  local_690;
  long local_670;
  _Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
  local_668;
  __native_type local_640;
  undefined8 uStack_618;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5c0;
  undefined1 local_560 [424];
  histogram<long,_true> local_3b8;
  histogram<long,_true> local_218;
  
  lVar9 = *(long *)(this + 0x20);
  local_6b4 = i_flags;
  local_6b0 = i_random;
  local_694 = i_flags;
  if ((((*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3 != lVar9) ||
       (*(long *)(this + 0x60) - *(long *)(this + 0x58) >> 3 != lVar9)) ||
      (*(long *)(this + 0x78) - *(long *)(this + 0x70) >> 3 != lVar9)) ||
     (*(long *)(this + 0x90) - *(long *)(this + 0x88) >> 3 != lVar9)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  local_640.__data.__list.__next = (__pthread_internal_list *)0x0;
  uStack_618 = 0;
  local_640._16_8_ = 0;
  local_640.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_640.__align = 0;
  local_640._8_8_ = 0;
  local_600 = 0xc0;
  local_5f8 = 0;
  local_5c0 = 0;
  local_690.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_690.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_690.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b6._M_i = false;
  local_6a8 = (histogram<long,_true> *)i_target_put_count;
  local_6a0 = (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
               *)this;
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ::reserve(&local_690,*(size_type *)(this + 0xa0));
  for (uVar10 = 0; uVar10 < local_6a0->m_thread_count; uVar10 = uVar10 + 1) {
    local_560._0_8_ = &local_6b6;
    std::
    vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData>>
    ::
    emplace_back<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>const&,density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::FeedBack*,density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
              ((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData>>
                *)&local_690,local_6a0,(FeedBack **)local_560,
               (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *)&local_640.__data,local_6b0,&local_6b4);
  }
  uVar3 = get_num_of_processors();
  uVar10 = 0xfffffffffffffffe;
  if (3 < uVar3) {
    uVar10 = (ulong)((uint)((local_6b4 & eReserveCoreToMainThread) == eNone) * 2) |
             0xfffffffffffffffc;
  }
  lVar9 = 0;
  for (uVar6 = 0; uVar1 = local_6a0->m_thread_count, uVar6 < uVar1; uVar6 = uVar6 + 1) {
    bVar12 = uVar6 == 0;
    phVar7 = (histogram<long,_true> *)0;
    if (bVar12) {
      phVar7 = local_6a8;
    }
    i_affinity_mask = uVar10;
    if (bVar12) {
      i_affinity_mask = 1;
    }
    i_target_consume_count = (ulong)local_6a8 % uVar1 + (ulong)local_6a8 / uVar1;
    if (!bVar12) {
      i_target_consume_count = (ulong)local_6a8 / uVar1;
    }
    if (uVar3 < 2) {
      i_affinity_mask = 0xffffffffffffffff;
    }
    ThreadData::start((ThreadData *)
                      ((long)((local_690.
                               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_random).m_rand._M_x +
                      lVar9 + -0x50),uVar6,(size_t)phVar7,i_target_consume_count,i_affinity_mask);
    lVar9 = lVar9 + 0x1440;
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter
            ((LineUpdaterStreamAdapter *)local_560,local_6a0->m_output);
  phVar7 = local_6a8;
  Progress::Progress((Progress *)&local_3b8,(size_t)local_6a8);
  while( true ) {
    uVar10 = 0;
    uVar6 = 0;
    for (pTVar4 = local_690.
                  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar4 != local_690.
                  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar4 = pTVar4 + 1) {
      uVar6 = uVar6 + (__int_type)
                      (((pTVar4->m_incremental_stats)._M_t.
                        super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        .
                        super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                       ._M_head_impl)->m_produced).super___atomic_base<unsigned_long>;
      uVar10 = uVar10 + (((pTVar4->m_incremental_stats)._M_t.
                          super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                          .
                          super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                         ._M_head_impl)->m_consumed).super___atomic_base<unsigned_long>._M_i;
    }
    if ((phVar7 < uVar10) || (phVar7 < uVar6)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_6b5 = phVar7 <= uVar6;
    lVar9 = uVar6 - uVar10;
    if (uVar6 < uVar10 || lVar9 == 0) {
      local_6b6._M_i = false;
    }
    else {
      auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar13._0_8_ = lVar9;
      auVar13._12_4_ = 0x45300000;
      auVar14._8_4_ = (int)(uVar10 >> 0x20);
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = 0x45300000;
      local_6b6._M_i =
           0.2 < ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
    }
    i_ostream = (ostream *)(local_560 + 0x28);
    local_6b0._0_1_ = phVar7 <= uVar10;
    if ((local_6b4 & ePrintProgress) != eNone) {
      local_3b8._0_8_ = uVar10;
      std::operator<<(i_ostream,"Active threads: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::operator<<(i_ostream,", Consumed: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::operator<<(i_ostream," (");
      Progress::write_to_stream((Progress *)&local_3b8,i_ostream);
      std::operator<<(i_ostream,"), enqueued: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      LineUpdaterStreamAdapter::end_line_impl((LineUpdaterStreamAdapter *)local_560);
    }
    local_6b0._0_1_ = (byte)local_6b0 & local_6b5;
    if ((byte)local_6b0 != 0) break;
    local_218.m_title = (ostringstream)0xc8;
    local_218._1_7_ = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_218);
    phVar7 = local_6a8;
  }
  LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter((LineUpdaterStreamAdapter *)local_560);
  pTVar4 = local_690.
           super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar8 = local_690.
                super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar4; pTVar8 = pTVar8 + 1) {
    std::thread::join();
  }
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)local_560,"spawned by i-th thread",0x19,8);
  local_6a8 = &local_3b8;
  histogram<long,_true>::histogram(local_6a8,"exceptions_during_puts",0x19,8);
  local_6b0 = (EasyRandom *)&local_218;
  __n = (pointer)0x8;
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)local_6b0,"exceptions_during_consumes",0x19,8);
  FinalStats::FinalStats
            ((FinalStats *)&local_668,
             (long)(local_6a0->m_put_cases).
                   super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_6a0->m_put_cases).
                   super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_6a8 = (histogram<long,_true> *)&local_6a8->m_values;
  local_6b0 = (EasyRandom *)((long)local_6b0 + 0x178);
  __buf = extraout_RDX;
  for (uVar10 = 0;
      pTVar4 = local_690.
               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pPVar11 = local_668._M_impl.super__Vector_impl_data._M_start,
      uVar10 < local_6a0->m_thread_count; uVar10 = uVar10 + 1) {
    pTVar8 = local_690.
             super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar10;
    FinalStats::operator+=((FinalStats *)&local_668,&pTVar8->m_final_stats);
    __n = pTVar4[uVar10].m_final_stats.m_counters.
          super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    local_670 = 0;
    for (pPVar5 = (pTVar8->m_final_stats).m_counters.
                  super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar5 != __n; pPVar5 = pPVar5 + 1) {
      local_670 = local_670 + pPVar5->m_spawned;
    }
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)(local_560 + 0x178),&local_670);
    __buf = extraout_RDX_00;
    if ((local_694 & eTestExceptions) != eNone) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_6a8,
                 &pTVar4[uVar10].m_final_stats.m_exceptions_during_puts);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_6b0,
                 &pTVar4[uVar10].m_final_stats.m_exceptions_during_consumes);
      __buf = extraout_RDX_01;
    }
  }
  for (; pQVar2 = local_6a0, pPVar11 != local_668._M_impl.super__Vector_impl_data._M_finish;
      pPVar11 = pPVar11 + 1) {
    if (pPVar11->m_existing != 0) {
      detail::assert_failed<>
                ("counter.m_existing == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0x114);
      __buf = extraout_RDX_02;
    }
  }
  histogram<long,_true>::write
            ((histogram<long,_true> *)local_560,(int)local_6a0->m_output,__buf,(size_t)__n);
  if ((local_694 & eTestExceptions) != eNone) {
    histogram<long,_true>::write(&local_3b8,(int)pQVar2->m_output,__buf_00,(size_t)__n);
    histogram<long,_true>::write(&local_218,(int)pQVar2->m_output,__buf_01,(size_t)__n);
  }
  std::
  _Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
  ::~_Vector_base(&local_668);
  histogram<long,_true>::~histogram(&local_218);
  histogram<long,_true>::~histogram(&local_3b8);
  histogram<long,_true>::~histogram((histogram<long,_true> *)local_560);
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ::~vector(&local_690);
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_640.__data);
  return;
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }